

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  int iVar2;
  uint reverse;
  void *__dest;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  void *__src;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  Mat local_198;
  Mat cell;
  Mat hidden;
  Mat local_c0;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = this->direction;
  Mat::Mat(&hidden,this->num_output,4,opt->workspace_allocator);
  iVar2 = -100;
  if ((hidden.data == (void *)0x0) || ((long)hidden.c * hidden.cstep == 0)) goto LAB_001f6b10;
  Mat::fill(&hidden,0.0);
  Mat::Mat(&cell,this->num_output,4,opt->workspace_allocator);
  iVar2 = -100;
  if ((cell.data != (void *)0x0) && ((long)cell.c * cell.cstep != 0)) {
    Mat::fill(&cell,0.0);
    Mat::create(top_blob,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      reverse = this->direction;
      if (reverse < 2) {
        Mat::channel(&top_blob_forward,&this->weight_xc_data,0);
        Mat::channel(&top_blob_reverse,&this->bias_c_data,0);
        Mat::channel(&local_198,&this->weight_hc_data,0);
        iVar2 = lstm(bottom_blob,top_blob,reverse,&top_blob_forward,&top_blob_reverse,&local_198,
                     &hidden,&cell,opt);
        Mat::~Mat(&local_198);
        Mat::~Mat(&top_blob_reverse);
        Mat::~Mat(&top_blob_forward);
        if (iVar2 != 0) goto LAB_001f6b03;
        reverse = this->direction;
      }
      if (reverse == 2) {
        Mat::Mat(&top_blob_forward,this->num_output,_h,4,opt->workspace_allocator);
        iVar2 = -100;
        if ((top_blob_forward.data == (void *)0x0) ||
           ((long)top_blob_forward.c * top_blob_forward.cstep == 0)) {
          cVar3 = '\0';
        }
        else {
          Mat::Mat(&top_blob_reverse,this->num_output,_h,4,opt->workspace_allocator);
          iVar2 = -100;
          if ((top_blob_reverse.data == (void *)0x0) ||
             ((long)top_blob_reverse.c * top_blob_reverse.cstep == 0)) {
LAB_001f6ae0:
            uVar4 = 0;
          }
          else {
            Mat::channel(&local_198,&this->weight_xc_data,0);
            Mat::channel(&local_78,&this->bias_c_data,0);
            Mat::channel(&local_c0,&this->weight_hc_data,0);
            iVar2 = lstm(bottom_blob,&top_blob_forward,0,&local_198,&local_78,&local_c0,&hidden,
                         &cell,opt);
            Mat::~Mat(&local_c0);
            Mat::~Mat(&local_78);
            Mat::~Mat(&local_198);
            if (iVar2 != 0) goto LAB_001f6ae0;
            Mat::fill(&hidden,0.0);
            Mat::fill(&cell,0.0);
            Mat::channel(&local_198,&this->weight_xc_data,1);
            Mat::channel(&local_78,&this->bias_c_data,1);
            Mat::channel(&local_c0,&this->weight_hc_data,1);
            iVar2 = lstm(bottom_blob,&top_blob_reverse,1,&local_198,&local_78,&local_c0,&hidden,
                         &cell,opt);
            Mat::~Mat(&local_c0);
            Mat::~Mat(&local_78);
            Mat::~Mat(&local_198);
            uVar4 = 0;
            if (iVar2 == 0) {
              uVar5 = (ulong)_h;
              if ((int)_h < 1) {
                uVar5 = uVar4;
              }
              for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
                __src = (void *)((long)top_blob_reverse.w * uVar4 * top_blob_reverse.elemsize +
                                (long)top_blob_reverse.data);
                __dest = (void *)((long)top_blob->w * uVar4 * top_blob->elemsize +
                                 (long)top_blob->data);
                memcpy(__dest,(void *)((long)top_blob_forward.w * uVar4 * top_blob_forward.elemsize
                                      + (long)top_blob_forward.data),(long)this->num_output << 2);
                memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                       (long)this->num_output << 2);
              }
              iVar2 = 0;
              uVar4 = 1;
            }
          }
          cVar3 = (char)uVar4;
          Mat::~Mat(&top_blob_reverse);
        }
        Mat::~Mat(&top_blob_forward);
        if (cVar3 == '\0') goto LAB_001f6b03;
      }
      iVar2 = 0;
    }
  }
LAB_001f6b03:
  Mat::~Mat(&cell);
LAB_001f6b10:
  Mat::~Mat(&hidden);
  return iVar2;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}